

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::
strTree<kj::StringTree,kj::StringTree,kj::StringTree,kj::String&,char_const(&)[40],kj::String&,char_const(&)[2],kj::String&,char_const(&)[19]>
          (StringTree *__return_storage_ptr__,kj *this,StringTree *params,StringTree *params_1,
          StringTree *params_2,String *params_3,char (*params_4) [40],String *params_5,
          char (*params_6) [2],String *params_7,char (*params_8) [19])

{
  StringTree *pSVar1;
  StringTree *pSVar2;
  StringTree *pSVar3;
  String *pSVar4;
  char (*value) [40];
  char (*value_00) [2];
  char (*value_01) [19];
  StringTree *__return_storage_ptr___00;
  ArrayPtr<const_char> local_a0;
  ArrayPtr<const_char> local_90;
  ArrayPtr<const_char> local_80;
  ArrayPtr<const_char> local_70;
  ArrayPtr<const_char> local_60;
  ArrayPtr<const_char> local_50;
  String *local_40;
  char (*params_local_4) [40];
  String *params_local_3;
  StringTree *params_local_2;
  StringTree *params_local_1;
  StringTree *params_local;
  
  __return_storage_ptr___00 = __return_storage_ptr__;
  local_40 = params_3;
  params_local_4 = (char (*) [40])params_2;
  params_local_3 = (String *)params_1;
  params_local_2 = params;
  params_local_1 = (StringTree *)this;
  params_local = __return_storage_ptr__;
  pSVar1 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)this);
  pSVar1 = _::toStringTreeOrCharSequence(pSVar1);
  pSVar2 = fwd<kj::StringTree>(params_local_2);
  pSVar2 = _::toStringTreeOrCharSequence(pSVar2);
  pSVar3 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_local_3);
  pSVar3 = _::toStringTreeOrCharSequence(pSVar3);
  pSVar4 = fwd<kj::String&>((String *)params_local_4);
  local_50 = _::toStringTreeOrCharSequence<kj::String&>(pSVar4);
  value = ::const((char (*) [40])local_40);
  local_60 = _::toStringTreeOrCharSequence<char_const(&)[40]>(value);
  pSVar4 = fwd<kj::String&>((String *)params_4);
  local_70 = _::toStringTreeOrCharSequence<kj::String&>(pSVar4);
  value_00 = ::const((char (*) [2])params_5);
  local_80 = _::toStringTreeOrCharSequence<char_const(&)[2]>(value_00);
  pSVar4 = fwd<kj::String&>((String *)params_6);
  local_90 = _::toStringTreeOrCharSequence<kj::String&>(pSVar4);
  value_01 = ::const((char (*) [19])params_7);
  local_a0 = _::toStringTreeOrCharSequence<char_const(&)[19]>(value_01);
  StringTree::
  concat<kj::StringTree,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr___00,pSVar1,pSVar2,pSVar3,(StringTree *)&local_50,&local_60,
             &local_70,&local_80,&local_90,&local_a0,
             (ArrayPtr<const_char> *)__return_storage_ptr___00);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}